

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

void __thiscall mkvparser::Track::~Track(Track *this)

{
  void *pvVar1;
  undefined8 *puVar2;
  undefined8 *in_RDI;
  ContentEncoding *in_stack_00000010;
  ContentEncoding *encoding;
  ContentEncoding **j;
  ContentEncoding **i;
  Info *info;
  Info *in_stack_ffffffffffffffe0;
  undefined8 *puVar3;
  undefined8 *local_18;
  
  *in_RDI = &PTR__Track_00c7d8c8;
  Info::Clear(in_stack_ffffffffffffffe0);
  puVar3 = (undefined8 *)in_RDI[0x17];
  local_18 = (undefined8 *)in_RDI[0x16];
  while (local_18 != puVar3) {
    puVar2 = local_18 + 1;
    pvVar1 = (void *)*local_18;
    local_18 = puVar2;
    if (pvVar1 != (void *)0x0) {
      ContentEncoding::~ContentEncoding(in_stack_00000010);
      operator_delete(pvVar1);
    }
  }
  if ((void *)in_RDI[0x16] != (void *)0x0) {
    operator_delete__((void *)in_RDI[0x16]);
  }
  EOSBlock::~EOSBlock((EOSBlock *)0x181a90);
  Info::~Info((Info *)0x181a9e);
  return;
}

Assistant:

Track::~Track() {
  Info& info = const_cast<Info&>(m_info);
  info.Clear();

  ContentEncoding** i = content_encoding_entries_;
  ContentEncoding** const j = content_encoding_entries_end_;

  while (i != j) {
    ContentEncoding* const encoding = *i++;
    delete encoding;
  }

  delete[] content_encoding_entries_;
}